

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_ep_connect(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err result;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  if (*(char *)((long)arg + 0x33) == '\x01') {
    nni_mtx_unlock((nni_mtx *)arg);
    result = NNG_ECLOSED;
  }
  else {
    if (*(long *)((long)arg + 0x58) == 0) {
      _Var1 = nni_aio_start(aio,ipc_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 0x58) = aio;
        nng_stream_dialer_dial
                  (*(nng_stream_dialer **)((long)arg + 0x38),(nng_aio *)((long)arg + 0x60));
      }
      nni_mtx_unlock((nni_mtx *)arg);
      return;
    }
    nni_mtx_unlock((nni_mtx *)arg);
    result = NNG_EBUSY;
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
ipc_ep_connect(void *arg, nni_aio *aio)
{
	ipc_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (ep->user_aio != NULL) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_EBUSY);
		return;
	}

	if (!nni_aio_start(aio, ipc_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->user_aio = aio;
	nng_stream_dialer_dial(ep->dialer, &ep->conn_aio);
	nni_mtx_unlock(&ep->mtx);
}